

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

double derivative_in_direction<sparse_parameters>
                 (vw *param_1,bfgs *b,float *mem,int *origin,sparse_parameters *weights)

{
  __node_base *p_Var1;
  double dVar2;
  
  p_Var1 = &(weights->_map)._M_h._M_before_begin;
  dVar2 = 0.0;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    dVar2 = dVar2 + (double)*(float *)&(*(_Hash_node_base **)
                                         &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor
                                       )[1]._M_nxt *
                    (double)mem[((ulong)p_Var1[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                                (long)b->mem_stride + (long)(*origin % b->mem_stride)];
  }
  return dVar2;
}

Assistant:

double derivative_in_direction(vw& /* all */, bfgs& b, float* mem, int& origin, T& weights)
{
  double ret = 0.;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    ret += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * (&(*w))[W_DIR];
  }
  return ret;
}